

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_node_free(lysf_ctx *ctx,lysp_node *node)

{
  uint16_t uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  lysp_node *plVar6;
  long lVar7;
  long lVar8;
  lysp_restr *plVar9;
  lysp_when *when_00;
  ulong local_1d8;
  ulong local_1c0;
  lysp_ext_instance *local_1a8;
  lysp_ext_instance *local_190;
  lysp_ext_instance *local_178;
  ulong local_158;
  lysp_ext_instance *local_148;
  ulong local_128;
  lysp_ext_instance *local_110;
  lysp_ext_instance *local_100;
  ulong local_f0;
  ulong local_e0;
  uint64_t c___10;
  uint64_t c___9;
  uint64_t c___8;
  uint64_t c___7;
  uint64_t c___6;
  uint64_t c___5;
  uint64_t c___4;
  uint64_t c___3;
  uint64_t c___2;
  uint64_t c___1;
  uint64_t c__;
  lysp_when *when;
  lysp_restr *musts;
  lysp_node_notif *notif;
  lysp_node_action_inout *inout;
  lysp_node_action *act;
  lysp_node_uses *uses;
  lysp_node_case *cas;
  lysp_node_choice *choice;
  lysp_node_list *list;
  lysp_node_leaflist *llist;
  lysp_node_leaf *leaf;
  lysp_node_container *cont;
  lysp_node *next;
  lysp_node *child;
  lysp_node *node_local;
  lysf_ctx *ctx_local;
  
  plVar9 = lysp_node_musts(node);
  when_00 = lysp_node_when(node);
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  c___1 = 0;
  while( true ) {
    if (node->iffeatures == (lysp_qname *)0x0) {
      local_f0 = 0;
    }
    else {
      local_f0 = *(ulong *)&node->iffeatures[-1].flags;
    }
    if (local_f0 <= c___1) break;
    lysp_qname_free(ctx->ctx,node->iffeatures + c___1);
    c___1 = c___1 + 1;
  }
  if (node->iffeatures != (lysp_qname *)0x0) {
    free(&node->iffeatures[-1].flags);
  }
  c___2 = 0;
  while( true ) {
    if (node->exts == (lysp_ext_instance *)0x0) {
      local_100 = (lysp_ext_instance *)0x0;
    }
    else {
      local_100 = node->exts[-1].exts;
    }
    if (local_100 <= c___2) break;
    lysp_ext_instance_free(ctx,node->exts + c___2);
    c___2 = c___2 + 1;
  }
  if (node->exts != (lysp_ext_instance *)0x0) {
    free(&node->exts[-1].exts);
  }
  if (when_00 != (lysp_when *)0x0) {
    lysp_when_free(ctx,when_00);
    free(when_00);
  }
  c___3 = 0;
  while( true ) {
    if (plVar9 == (lysp_restr *)0x0) {
      local_110 = (lysp_ext_instance *)0x0;
    }
    else {
      local_110 = plVar9[-1].exts;
    }
    if (local_110 <= c___3) break;
    lysp_restr_free(ctx,plVar9 + c___3);
    c___3 = c___3 + 1;
  }
  if (plVar9 != (lysp_restr *)0x0) {
    free(&plVar9[-1].exts);
  }
  uVar1 = node->nodetype;
  if (uVar1 == 1) {
    lydict_remove(ctx->ctx,(char *)node[1].next);
    c___4 = 0;
    while( true ) {
      if (node[1].name == (char *)0x0) {
        local_128 = 0;
      }
      else {
        local_128 = *(ulong *)(node[1].name + -8);
      }
      if (local_128 <= c___4) break;
      lysp_tpdf_free(ctx,(lysp_tpdf *)(node[1].name + c___4 * 0xb0));
      c___4 = c___4 + 1;
    }
    if (node[1].name != (char *)0x0) {
      free(node[1].name + -8);
    }
    if (node[1].dsc != (char *)0x0) {
      next = (lysp_node *)node[1].dsc;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
    next = (lysp_node *)node[1].ref;
    while (next != (lysp_node *)0x0) {
      plVar6 = next->next;
      lysp_node_free(ctx,next);
      next = plVar6;
    }
    if (node[1].iffeatures != (lysp_qname *)0x0) {
      next = (lysp_node *)node[1].iffeatures;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
    if (node[1].exts != (lysp_ext_instance *)0x0) {
      next = (lysp_node *)node[1].exts;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
  }
  else if (uVar1 == 2) {
    next = node[1].parent;
    while (next != (lysp_node *)0x0) {
      plVar6 = next->next;
      lysp_node_free(ctx,next);
      next = plVar6;
    }
    lydict_remove(ctx->ctx,(char *)node[1].next);
  }
  else if (uVar1 == 4) {
    lysp_type_free(ctx,(lysp_type *)&node[1].next);
    lydict_remove(ctx->ctx,(char *)node[2].exts);
    lydict_remove(ctx->ctx,(char *)node[3].parent);
  }
  else if (uVar1 == 8) {
    lysp_type_free(ctx,(lysp_type *)&node[1].next);
    lydict_remove(ctx->ctx,(char *)node[2].exts);
    c___5 = 0;
    while( true ) {
      if (node[3].parent == (lysp_node *)0x0) {
        local_148 = (lysp_ext_instance *)0x0;
      }
      else {
        local_148 = node[3].parent[-1].exts;
      }
      if (local_148 <= c___5) break;
      lysp_qname_free(ctx->ctx,(lysp_qname *)(&(node[3].parent)->parent + c___5 * 3));
      c___5 = c___5 + 1;
    }
    if (node[3].parent != (lysp_node *)0x0) {
      free(&node[3].parent[-1].exts);
    }
  }
  else if (uVar1 == 0x10) {
    lydict_remove(ctx->ctx,(char *)node[1].next);
    c___6 = 0;
    while( true ) {
      if (node[1].name == (char *)0x0) {
        local_158 = 0;
      }
      else {
        local_158 = *(ulong *)(node[1].name + -8);
      }
      if (local_158 <= c___6) break;
      lysp_tpdf_free(ctx,(lysp_tpdf *)(node[1].name + c___6 * 0xb0));
      c___6 = c___6 + 1;
    }
    if (node[1].name != (char *)0x0) {
      free(node[1].name + -8);
    }
    if (node[1].dsc != (char *)0x0) {
      next = (lysp_node *)node[1].dsc;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
    next = (lysp_node *)node[1].ref;
    while (next != (lysp_node *)0x0) {
      plVar6 = next->next;
      lysp_node_free(ctx,next);
      next = plVar6;
    }
    if (node[1].iffeatures != (lysp_qname *)0x0) {
      next = (lysp_node *)node[1].iffeatures;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
    if (node[1].exts != (lysp_ext_instance *)0x0) {
      next = (lysp_node *)node[1].exts;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
    c___7 = 0;
    while( true ) {
      if (node[2].parent == (lysp_node *)0x0) {
        local_178 = (lysp_ext_instance *)0x0;
      }
      else {
        local_178 = node[2].parent[-1].exts;
      }
      if (local_178 <= c___7) break;
      lysp_qname_free(ctx->ctx,(lysp_qname *)(&(node[2].parent)->parent + c___7 * 3));
      c___7 = c___7 + 1;
    }
    if (node[2].parent != (lysp_node *)0x0) {
      free(&node[2].parent[-1].exts);
    }
  }
  else if ((uVar1 != 0x20) && (uVar1 != 0x60)) {
    if (uVar1 == 0x80) {
      next = node[1].parent;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
    else if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
      c___9 = 0;
      while( true ) {
        if (node[1].parent == (lysp_node *)0x0) {
          local_1a8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_1a8 = node[1].parent[-1].exts;
        }
        if (local_1a8 <= c___9) break;
        lysp_tpdf_free(ctx,(lysp_tpdf *)((long)node[1].parent + c___9 * 0xb0));
        c___9 = c___9 + 1;
      }
      if (node[1].parent != (lysp_node *)0x0) {
        free(&node[1].parent[-1].exts);
      }
      lVar3._0_2_ = node[1].nodetype;
      lVar3._2_2_ = node[1].flags;
      lVar3._4_4_ = *(undefined4 *)&node[1].field_0xc;
      if (lVar3 != 0) {
        next = *(lysp_node **)&node[1].nodetype;
        while (next != (lysp_node *)0x0) {
          plVar6 = next->next;
          lysp_node_free(ctx,next);
          next = plVar6;
        }
      }
      if (*(short *)&node[1].name != 0) {
        lysp_node_free(ctx,(lysp_node *)&node[1].next);
      }
      if (*(short *)&node[2].exts != 0) {
        lysp_node_free(ctx,(lysp_node *)&node[2].iffeatures);
      }
    }
    else if (uVar1 == 0x400) {
      local_e0 = 0;
      while( true ) {
        lVar7._0_2_ = node[1].nodetype;
        lVar7._2_2_ = node[1].flags;
        lVar7._4_4_ = *(undefined4 *)&node[1].field_0xc;
        if (lVar7 == 0) {
          local_1d8 = 0;
        }
        else {
          local_1d8 = *(ulong *)(*(long *)&node[1].nodetype + -8);
        }
        if (local_1d8 <= local_e0) break;
        lysp_tpdf_free(ctx,(lysp_tpdf *)(*(long *)&node[1].nodetype + local_e0 * 0xb0));
        local_e0 = local_e0 + 1;
      }
      lVar8._0_2_ = node[1].nodetype;
      lVar8._2_2_ = node[1].flags;
      lVar8._4_4_ = *(undefined4 *)&node[1].field_0xc;
      if (lVar8 != 0) {
        free((void *)(*(long *)&node[1].nodetype + -8));
      }
      if (node[1].next != (lysp_node *)0x0) {
        next = node[1].next;
        while (next != (lysp_node *)0x0) {
          plVar6 = next->next;
          lysp_node_free(ctx,next);
          next = plVar6;
        }
      }
      next = (lysp_node *)node[1].name;
      while (next != (lysp_node *)0x0) {
        plVar6 = next->next;
        lysp_node_free(ctx,next);
        next = plVar6;
      }
    }
    else if (uVar1 == 0x800) {
      c___8 = 0;
      while( true ) {
        if (node[1].parent == (lysp_node *)0x0) {
          local_190 = (lysp_ext_instance *)0x0;
        }
        else {
          local_190 = node[1].parent[-1].exts;
        }
        if (local_190 <= c___8) break;
        lysp_refine_free(ctx,(lysp_refine *)((long)node[1].parent + c___8 * 0x50));
        c___8 = c___8 + 1;
      }
      if (node[1].parent != (lysp_node *)0x0) {
        free(&node[1].parent[-1].exts);
      }
      lVar2._0_2_ = node[1].nodetype;
      lVar2._2_2_ = node[1].flags;
      lVar2._4_4_ = *(undefined4 *)&node[1].field_0xc;
      if (lVar2 != 0) {
        next = *(lysp_node **)&node[1].nodetype;
        while (next != (lysp_node *)0x0) {
          plVar6 = next->next;
          lysp_node_free(ctx,next);
          next = plVar6;
        }
      }
    }
    else {
      if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
        c___10 = 0;
        while( true ) {
          lVar4._0_2_ = node[1].nodetype;
          lVar4._2_2_ = node[1].flags;
          lVar4._4_4_ = *(undefined4 *)&node[1].field_0xc;
          if (lVar4 == 0) {
            local_1c0 = 0;
          }
          else {
            local_1c0 = *(ulong *)(*(long *)&node[1].nodetype + -8);
          }
          if (local_1c0 <= c___10) break;
          lysp_tpdf_free(ctx,(lysp_tpdf *)(*(long *)&node[1].nodetype + c___10 * 0xb0));
          c___10 = c___10 + 1;
        }
        lVar5._0_2_ = node[1].nodetype;
        lVar5._2_2_ = node[1].flags;
        lVar5._4_4_ = *(undefined4 *)&node[1].field_0xc;
        if (lVar5 != 0) {
          free((void *)(*(long *)&node[1].nodetype + -8));
        }
        if (node[1].next != (lysp_node *)0x0) {
          next = node[1].next;
          while (next != (lysp_node *)0x0) {
            plVar6 = next->next;
            lysp_node_free(ctx,next);
            next = plVar6;
          }
        }
        next = (lysp_node *)node[1].name;
        while (next != (lysp_node *)0x0) {
          plVar6 = next->next;
          lysp_node_free(ctx,next);
          next = plVar6;
        }
        return;
      }
      if (uVar1 == 0x4000) {
        lysp_grp_free(ctx,(lysp_node_grp *)node);
      }
      else if (uVar1 == 0x8000) {
        lysp_augment_free(ctx,(lysp_node_augment *)node);
      }
      else {
        ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
               ,0x25f);
      }
    }
  }
  free(node);
  return;
}

Assistant:

void
lysp_node_free(struct lysf_ctx *ctx, struct lysp_node *node)
{
    struct lysp_node *child, *next;
    struct lysp_node_container *cont;
    struct lysp_node_leaf *leaf;
    struct lysp_node_leaflist *llist;
    struct lysp_node_list *list;
    struct lysp_node_choice *choice;
    struct lysp_node_case *cas;
    struct lysp_node_uses *uses;
    struct lysp_node_action *act;
    struct lysp_node_action_inout *inout;
    struct lysp_node_notif *notif;
    struct lysp_restr *musts = lysp_node_musts(node);
    struct lysp_when *when = lysp_node_when(node);

    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);
    FREE_ARRAY(ctx->ctx, node->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, node->exts, lysp_ext_instance_free);

    FREE_MEMBER(ctx, when, lysp_when_free);
    FREE_ARRAY(ctx, musts, lysp_restr_free);

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = (struct lysp_node_container *)node;

        lydict_remove(ctx->ctx, cont->presence);
        FREE_ARRAY(ctx, cont->typedefs, lysp_tpdf_free);
        if (cont->groupings) {
            LY_LIST_FOR_SAFE(&cont->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(cont->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (cont->actions) {
            LY_LIST_FOR_SAFE(&cont->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (cont->notifs) {
            LY_LIST_FOR_SAFE(&cont->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_LEAF:
        leaf = (struct lysp_node_leaf *)node;

        lysp_type_free(ctx, &leaf->type);
        lydict_remove(ctx->ctx, leaf->units);
        lydict_remove(ctx->ctx, leaf->dflt.str);
        break;
    case LYS_LEAFLIST:
        llist = (struct lysp_node_leaflist *)node;

        lysp_type_free(ctx, &llist->type);
        lydict_remove(ctx->ctx, llist->units);
        FREE_ARRAY(ctx->ctx, llist->dflts, lysp_qname_free);
        break;
    case LYS_LIST:
        list = (struct lysp_node_list *)node;

        lydict_remove(ctx->ctx, list->key);
        FREE_ARRAY(ctx, list->typedefs, lysp_tpdf_free);
        if (list->groupings) {
            LY_LIST_FOR_SAFE(&list->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(list->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (list->actions) {
            LY_LIST_FOR_SAFE(&list->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (list->notifs) {
            LY_LIST_FOR_SAFE(&list->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        FREE_ARRAY(ctx->ctx, list->uniques, lysp_qname_free);
        break;
    case LYS_CHOICE:
        choice = (struct lysp_node_choice *)node;

        LY_LIST_FOR_SAFE(choice->child, next, child) {
            lysp_node_free(ctx, child);
        }
        lydict_remove(ctx->ctx, choice->dflt.str);
        break;
    case LYS_CASE:
        cas = (struct lysp_node_case *)node;

        LY_LIST_FOR_SAFE(cas->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        /* nothing special to do */
        break;
    case LYS_USES:
        uses = (struct lysp_node_uses *)node;

        FREE_ARRAY(ctx, uses->refines, lysp_refine_free);
        if (uses->augments) {
            LY_LIST_FOR_SAFE(&uses->augments->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        act = (struct lysp_node_action *)node;

        FREE_ARRAY(ctx, act->typedefs, lysp_tpdf_free);
        if (act->groupings) {
            LY_LIST_FOR_SAFE(&act->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (act->input.nodetype) {
            lysp_node_free(ctx, &act->input.node);
        }
        if (act->output.nodetype) {
            lysp_node_free(ctx, &act->output.node);
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        inout = (struct lysp_node_action_inout *)node;

        FREE_ARRAY(ctx, inout->typedefs, lysp_tpdf_free);
        if (inout->groupings) {
            LY_LIST_FOR_SAFE(&inout->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(inout->child, next, child) {
            lysp_node_free(ctx, child);
        }
        /* do not free the node, it is never standalone but part of the action node */
        return;
    case LYS_NOTIF:
        notif = (struct lysp_node_notif *)node;

        FREE_ARRAY(ctx, notif->typedefs, lysp_tpdf_free);
        if (notif->groupings) {
            LY_LIST_FOR_SAFE(&notif->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(notif->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_GROUPING:
        lysp_grp_free(ctx, (struct lysp_node_grp *)node);
        break;
    case LYS_AUGMENT:
        lysp_augment_free(ctx, ((struct lysp_node_augment *)node));
        break;
    default:
        LOGINT(ctx->ctx);
    }

    free(node);
}